

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_lad.cc
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar7;
  basic_command_line_parser<char> *this;
  size_type sVar8;
  ostream *poVar9;
  any *paVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  int i;
  int j;
  uint uVar11;
  allocator<char> local_2ca;
  allocator<char> local_2c9;
  InputGraph graph;
  basic_parsed_options<char> local_2a8;
  string pattern_format_name;
  variables_map options_vars;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_1f8 [144];
  positional_options_description positional_options;
  options_description all_options;
  options_description display_options;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options_vars,"Program options",(allocator<char> *)&all_options);
  uVar1 = (uint)boost::program_options::options_description::m_default_line_length;
  uVar11 = (uint)boost::program_options::options_description::m_default_line_length >> 1;
  boost::program_options::options_description::options_description
            (&display_options,(string *)&options_vars,
             (uint)boost::program_options::options_description::m_default_line_length,uVar11);
  std::__cxx11::string::~string((string *)&options_vars);
  _options_vars = boost::program_options::options_description::add_options();
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&options_vars,"help");
  ptVar7 = boost::program_options::value<std::__cxx11::string>();
  boost::program_options::options_description_easy_init::operator()
            (pcVar6,(value_semantic *)0x11c993,(char *)ptVar7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options_vars,"All options",(allocator<char> *)&pattern_format_name);
  boost::program_options::options_description::options_description
            (&all_options,(string *)&options_vars,uVar1,uVar11);
  std::__cxx11::string::~string((string *)&options_vars);
  _options_vars = boost::program_options::options_description::add_options();
  boost::program_options::options_description_easy_init::operator()
            ((char *)&options_vars,"graph-file");
  boost::program_options::options_description::add(&all_options);
  boost::program_options::positional_options_description::positional_options_description
            (&positional_options);
  iVar3 = 1;
  boost::program_options::positional_options_description::add((char *)&positional_options,0x11c0be);
  boost::program_options::variables_map::variables_map(&options_vars);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&pattern_format_name,argc,argv);
  this = boost::program_options::basic_command_line_parser<char>::options
                   ((basic_command_line_parser<char> *)&pattern_format_name,&all_options);
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)this);
  boost::program_options::basic_command_line_parser<char>::run(&local_2a8,this);
  boost::program_options::store((basic_parsed_options *)&local_2a8,&options_vars,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&local_2a8.options);
  boost::program_options::detail::cmdline::~cmdline((cmdline *)&pattern_format_name);
  boost::program_options::notify(&options_vars);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pattern_format_name,"help",(allocator<char> *)&local_2a8);
  sVar8 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_1f8,&pattern_format_name);
  std::__cxx11::string::~string((string *)&pattern_format_name);
  if (sVar8 != 0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar9 = std::operator<<(poVar9,*argv);
    poVar9 = std::operator<<(poVar9," [options] graph-file");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar9 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,&display_options);
    iVar3 = 0;
    std::endl<char,std::char_traits<char>>(poVar9);
    goto LAB_00107c1e;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pattern_format_name,"graph-file",(allocator<char> *)&local_2a8);
  sVar8 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_1f8,&pattern_format_name);
  std::__cxx11::string::~string((string *)&pattern_format_name);
  if (sVar8 == 0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar9 = std::operator<<(poVar9,*argv);
    poVar9 = std::operator<<(poVar9," [options] graph-file");
    std::endl<char,std::char_traits<char>>(poVar9);
    iVar3 = 1;
    goto LAB_00107c1e;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"format",&local_2ca);
  sVar8 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_1f8,(key_type *)&local_2a8);
  if (sVar8 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pattern_format_name,"auto",(allocator<char> *)&graph);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&graph,"format",&local_2c9);
    paVar10 = (any *)boost::program_options::abstract_variables_map::operator[]
                               ((string *)&options_vars);
    __str = boost::any_cast<std::__cxx11::string_const&>(paVar10);
    std::__cxx11::string::string((string *)&pattern_format_name,__str);
    std::__cxx11::string::~string((string *)&graph);
  }
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"graph-file",&local_2ca);
  paVar10 = (any *)boost::program_options::abstract_variables_map::operator[]
                             ((string *)&options_vars);
  boost::any_cast<std::__cxx11::string_const&>(paVar10);
  read_file_format((string *)&graph,&pattern_format_name);
  std::__cxx11::string::~string((string *)&local_2a8);
  bVar2 = InputGraph::has_vertex_labels(&graph);
  if (bVar2) {
LAB_00107b4b:
    poVar9 = std::operator<<((ostream *)&std::cerr,"Error: unsupported graph features");
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  else {
    bVar2 = InputGraph::has_edge_labels(&graph);
    if (bVar2) goto LAB_00107b4b;
    iVar3 = InputGraph::size(&graph);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    std::endl<char,std::char_traits<char>>(poVar9);
    iVar3 = 0;
    while( true ) {
      iVar4 = InputGraph::size(&graph);
      if (iVar4 <= iVar3) break;
      iVar4 = InputGraph::degree(&graph,iVar3);
      std::ostream::operator<<((ostream *)&std::cout,iVar4);
      iVar4 = 0;
      while( true ) {
        iVar5 = InputGraph::size(&graph);
        if (iVar5 <= iVar4) break;
        bVar2 = InputGraph::adjacent(&graph,iVar3,iVar4);
        if (bVar2) {
          poVar9 = std::operator<<((ostream *)&std::cout," ");
          std::ostream::operator<<((ostream *)poVar9,iVar4);
        }
        iVar4 = iVar4 + 1;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      iVar3 = iVar3 + 1;
    }
    iVar3 = 0;
  }
  InputGraph::~InputGraph(&graph);
  std::__cxx11::string::~string((string *)&pattern_format_name);
LAB_00107c1e:
  boost::program_options::variables_map::~variables_map(&options_vars);
  boost::program_options::positional_options_description::~positional_options_description
            (&positional_options);
  boost::program_options::options_description::~options_description(&all_options);
  boost::program_options::options_description::~options_description(&display_options);
  return iVar3;
}

Assistant:

auto main(int argc, char * argv[]) -> int
{
    try {
        po::options_description display_options{"Program options"};
        display_options.add_options()            //
            ("help", "Display help information") //
            ("format", po::value<string>(), "Specify input file format (auto, lad, labelledlad, dimacs)");

        po::options_description all_options{"All options"};
        all_options.add_options()("graph-file", "Specify the graph file");

        all_options.add(display_options);

        po::positional_options_description positional_options;
        positional_options
            .add("graph-file", 1);

        po::variables_map options_vars;
        po::store(po::command_line_parser(argc, argv)
                      .options(all_options)
                      .positional(positional_options)
                      .run(),
            options_vars);
        po::notify(options_vars);

        /* --help? Show a message, and exit. */
        if (options_vars.count("help")) {
            cout << "Usage: " << argv[0] << " [options] graph-file" << endl;
            cout << endl;
            cout << display_options << endl;
            return EXIT_SUCCESS;
        }

        /* No input file specified? Show a message and exit. */
        if (! options_vars.count("graph-file")) {
            cout << "Usage: " << argv[0] << " [options] graph-file" << endl;
            return EXIT_FAILURE;
        }

        /* Read in the graphs */
        string pattern_format_name = options_vars.count("format") ? options_vars["format"].as<string>() : "auto";
        auto graph = read_file_format(pattern_format_name, options_vars["graph-file"].as<string>());

        if (graph.has_vertex_labels() || graph.has_edge_labels()) {
            cerr << "Error: unsupported graph features" << endl;
            return EXIT_FAILURE;
        }

        cout << graph.size() << endl;
        for (int i = 0; i < graph.size(); ++i) {
            cout << graph.degree(i);
            for (int j = 0; j < graph.size(); ++j)
                if (graph.adjacent(i, j))
                    cout << " " << j;
            cout << endl;
        }

        return EXIT_SUCCESS;
    }
    catch (const GraphFileError & e) {
        cerr << "Error: " << e.what() << endl;
        if (e.file_at_least_existed())
            cerr << "Maybe try specifying --format?" << endl;
        return EXIT_FAILURE;
    }
    catch (const po::error & e) {
        cerr << "Error: " << e.what() << endl;
        cerr << "Try " << argv[0] << " --help" << endl;
        return EXIT_FAILURE;
    }
    catch (const exception & e) {
        cerr << "Error: " << e.what() << endl;
        return EXIT_FAILURE;
    }
}